

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void calc_target_weighted_pred_above
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *nb_mi,void *fun_ctxt,int num_planes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  byte in_CL;
  int in_EDX;
  MACROBLOCKD *in_RDI;
  int col_1;
  uint8_t m1_1;
  uint8_t m0_1;
  long *in_stack_00000008;
  int row_1;
  uint16_t *tmp16;
  int col;
  uint8_t m1;
  uint8_t m0;
  int row;
  int is_hbd;
  uint8_t *tmp;
  int32_t *mask;
  int32_t *wsrc;
  uint8_t *mask1d;
  int bw;
  calc_target_weighted_pred_ctxt *ctxt;
  int local_74;
  int local_6c;
  long local_68;
  int local_60;
  int local_58;
  long local_50;
  long local_48;
  long local_40;
  
  iVar2 = (uint)in_RDI->width << 2;
  puVar4 = av1_get_obmc_mask(*(int *)((long)in_stack_00000008 + 0x14));
  local_40 = *(long *)*in_stack_00000008 + (long)(in_EDX << 2) * 4;
  local_48 = *(long *)(*in_stack_00000008 + 8) + (long)(in_EDX << 2) * 4;
  local_50 = in_stack_00000008[1] + (long)(in_EDX << 2);
  iVar3 = is_cur_buf_hbd(in_RDI);
  if (iVar3 == 0) {
    for (local_58 = 0; local_58 < *(int *)((long)in_stack_00000008 + 0x14); local_58 = local_58 + 1)
    {
      bVar1 = puVar4[local_58];
      for (local_60 = 0; local_60 < (int)((uint)in_CL * 4); local_60 = local_60 + 1) {
        *(uint *)(local_40 + (long)local_60 * 4) =
             (uint)(byte)(0x40 - bVar1) * (uint)*(byte *)(local_50 + local_60);
        *(uint *)(local_48 + (long)local_60 * 4) = (uint)bVar1;
      }
      local_40 = local_40 + (long)iVar2 * 4;
      local_48 = local_48 + (long)iVar2 * 4;
      local_50 = local_50 + (int)in_stack_00000008[2];
    }
  }
  else {
    local_68 = local_50 * 2;
    for (local_6c = 0; local_6c < *(int *)((long)in_stack_00000008 + 0x14); local_6c = local_6c + 1)
    {
      bVar1 = puVar4[local_6c];
      for (local_74 = 0; local_74 < (int)((uint)in_CL * 4); local_74 = local_74 + 1) {
        *(uint *)(local_40 + (long)local_74 * 4) =
             (uint)(byte)(0x40 - bVar1) * (uint)*(ushort *)(local_68 + (long)local_74 * 2);
        *(uint *)(local_48 + (long)local_74 * 4) = (uint)bVar1;
      }
      local_40 = local_40 + (long)iVar2 * 4;
      local_48 = local_48 + (long)iVar2 * 4;
      local_68 = local_68 + (long)(int)in_stack_00000008[2] * 2;
    }
  }
  return;
}

Assistant:

static inline void calc_target_weighted_pred_above(
    MACROBLOCKD *xd, int rel_mi_row, int rel_mi_col, uint8_t op_mi_size,
    int dir, MB_MODE_INFO *nb_mi, void *fun_ctxt, const int num_planes) {
  (void)nb_mi;
  (void)num_planes;
  (void)rel_mi_row;
  (void)dir;

  struct calc_target_weighted_pred_ctxt *ctxt =
      (struct calc_target_weighted_pred_ctxt *)fun_ctxt;

  const int bw = xd->width << MI_SIZE_LOG2;
  const uint8_t *const mask1d = av1_get_obmc_mask(ctxt->overlap);

  int32_t *wsrc = ctxt->obmc_buffer->wsrc + (rel_mi_col * MI_SIZE);
  int32_t *mask = ctxt->obmc_buffer->mask + (rel_mi_col * MI_SIZE);
  const uint8_t *tmp = ctxt->tmp + rel_mi_col * MI_SIZE;
  const int is_hbd = is_cur_buf_hbd(xd);

  if (!is_hbd) {
    for (int row = 0; row < ctxt->overlap; ++row) {
      const uint8_t m0 = mask1d[row];
      const uint8_t m1 = AOM_BLEND_A64_MAX_ALPHA - m0;
      for (int col = 0; col < op_mi_size * MI_SIZE; ++col) {
        wsrc[col] = m1 * tmp[col];
        mask[col] = m0;
      }
      wsrc += bw;
      mask += bw;
      tmp += ctxt->tmp_stride;
    }
  } else {
    const uint16_t *tmp16 = CONVERT_TO_SHORTPTR(tmp);

    for (int row = 0; row < ctxt->overlap; ++row) {
      const uint8_t m0 = mask1d[row];
      const uint8_t m1 = AOM_BLEND_A64_MAX_ALPHA - m0;
      for (int col = 0; col < op_mi_size * MI_SIZE; ++col) {
        wsrc[col] = m1 * tmp16[col];
        mask[col] = m0;
      }
      wsrc += bw;
      mask += bw;
      tmp16 += ctxt->tmp_stride;
    }
  }
}